

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTzTransitionRule>::relocate
          (QArrayDataPointer<QTzTransitionRule> *this,qsizetype offset,QTzTransitionRule **data)

{
  bool bVar1;
  QTzTransitionRule *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  QTzTransitionRule *res;
  
  first = (QTzTransitionRule *)(*(long *)(in_RDI + 8) + in_RSI * 0xc);
  QtPrivate::q_relocate_overlap_n<QTzTransitionRule,long_long>
            (first,in_RDI,(QTzTransitionRule *)0x75fbf4);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QTzTransitionRule>,QTzTransitionRule_const*>
                        (data,(QArrayDataPointer<QTzTransitionRule> *)res), bVar1)) {
    *in_RDX = in_RSI * 0xc + *in_RDX;
  }
  *(QTzTransitionRule **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }